

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

sexp_conflict
sexp_condition_variable_signal
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict condvar)

{
  sexp psVar1;
  sexp_mark_stack_ptr_t *psVar2;
  sexp_mark_stack_ptr_t **ppsVar3;
  sexp_mark_stack_ptr_t *psVar4;
  sexp_mark_stack_ptr_t *psVar5;
  
  psVar1 = (ctx->value).type.setters;
  psVar2 = (sexp_mark_stack_ptr_t *)(psVar1->value).context.mark_stack[10].end;
  if (((ulong)psVar2 & 3) == 0) {
    psVar5 = (sexp_mark_stack_ptr_t *)&DAT_0000023e;
    do {
      psVar4 = psVar2;
      if (*(int *)&psVar4->start != 6) {
        return (sexp_conflict)&DAT_0000003e;
      }
      if (psVar4->end[0xb] == condvar) {
        ppsVar3 = &psVar5->prev;
        if (psVar5 == (sexp_mark_stack_ptr_t *)&DAT_0000023e) {
          ppsVar3 = (sexp_mark_stack_ptr_t **)&(psVar1->value).context.mark_stack[10].end;
        }
        *ppsVar3 = psVar4->prev;
        psVar4->prev = (((ctx->value).type.setters)->value).context.mark_stack[9].prev;
        (((ctx->value).type.setters)->value).context.mark_stack[9].prev = psVar4;
        if ((((ulong)psVar4->prev & 3) != 0) || (*(int *)&psVar4->prev->start != 6)) {
          (((ctx->value).type.setters)->value).context.mark_stack[10].start =
               (sexp_conflict *)psVar4;
        }
        *(undefined1 *)((long)psVar4->end + 0x60aa) = 0;
        *(undefined1 *)((long)psVar4->end + 0x60ab) = 0;
        return (sexp_conflict)0x13e;
      }
      psVar2 = psVar4->prev;
      psVar5 = psVar4;
    } while (((ulong)psVar4->prev & 3) == 0);
  }
  return (sexp_conflict)&DAT_0000003e;
}

Assistant:

sexp sexp_condition_variable_signal (sexp ctx, sexp self, sexp_sint_t n, sexp condvar) {
  sexp ls1=SEXP_NULL, ls2=sexp_global(ctx, SEXP_G_THREADS_PAUSED);
  for ( ; sexp_pairp(ls2); ls1=ls2, ls2=sexp_cdr(ls2))
    if (sexp_context_event(sexp_car(ls2)) == condvar) {
      if (ls1==SEXP_NULL)
        sexp_global(ctx, SEXP_G_THREADS_PAUSED) = sexp_cdr(ls2);
      else
        sexp_cdr(ls1) = sexp_cdr(ls2);
      sexp_cdr(ls2) = sexp_global(ctx, SEXP_G_THREADS_FRONT);
      sexp_global(ctx, SEXP_G_THREADS_FRONT) = ls2;
      if (! sexp_pairp(sexp_cdr(ls2)))
        sexp_global(ctx, SEXP_G_THREADS_BACK) = ls2;
      sexp_context_waitp(sexp_car(ls2)) = sexp_context_timeoutp(sexp_car(ls2)) = 0;
      return SEXP_TRUE;
    }
  return SEXP_FALSE;
}